

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

void gen_fop_DD(DisasContext_conflict7 *dc,int rd,int rs,
               _func_void_TCGContext_ptr_TCGv_i64_TCGv_ptr_TCGv_i64 *gen)

{
  TCGContext_conflict7 *pTVar1;
  long lVar2;
  long lVar3;
  uintptr_t o;
  TCGContext_conflict7 *tcg_ctx;
  ulong uVar4;
  TCGTemp *local_38;
  long local_30;
  
  pTVar1 = dc->uc->tcg_ctx;
  uVar4 = (ulong)((rd & 0x1eU) << 2);
  lVar2 = *(long *)((long)pTVar1->cpu_fpr + uVar4);
  local_38 = (TCGTemp *)(pTVar1->cpu_env + (long)pTVar1);
  local_30 = (long)&pTVar1->pool_cur + *(long *)((long)pTVar1->cpu_fpr + (ulong)(rs & 0x1e) * 4);
  tcg_gen_callN_sparc(pTVar1,helper_fsqrtd_sparc,(TCGTemp *)((long)&pTVar1->pool_cur + lVar2),2,
                      &local_38);
  local_38 = (TCGTemp *)(pTVar1->cpu_env + (long)pTVar1);
  tcg_gen_callN_sparc(pTVar1,helper_check_ieee_exceptions_sparc,
                      (TCGTemp *)(pTVar1->cpu_fsr + (long)pTVar1),1,&local_38);
  pTVar1 = dc->uc->tcg_ctx;
  lVar3 = *(long *)((long)pTVar1->cpu_fpr + uVar4);
  if (lVar3 != lVar2) {
    tcg_gen_op2_sparc(pTVar1,INDEX_op_mov_i64,(long)&pTVar1->pool_cur + lVar3,
                      (long)&pTVar1->pool_cur + lVar2);
  }
  return;
}

Assistant:

static inline void gen_fop_DD(DisasContext *dc, int rd, int rs,
                              void (*gen)(TCGContext *, TCGv_i64, TCGv_ptr, TCGv_i64))
{
    TCGContext *tcg_ctx = dc->uc->tcg_ctx;
    TCGv_i64 dst, src;

    src = gen_load_fpr_D(dc, rs);
    dst = gen_dest_fpr_D(dc, rd);

    gen(tcg_ctx, dst, tcg_ctx->cpu_env, src);
    gen_helper_check_ieee_exceptions(tcg_ctx, tcg_ctx->cpu_fsr, tcg_ctx->cpu_env);

    gen_store_fpr_D(dc, rd, dst);
}